

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yprc_node_common1(lys_ypr_ctx *pctx,lysc_node *node,ly_bool *flag)

{
  uint16_t *puVar1;
  ly_out *out;
  ly_stmt substmt;
  char *pcVar2;
  lysc_when **pplVar3;
  lysc_when *plVar4;
  char *pcVar5;
  uint uVar6;
  lysc_when *plVar7;
  
  out = (pctx->field_0).field_0.out;
  uVar6 = 0;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
      (undefined1  [24])0x0) {
    uVar6 = (uint)(pctx->field_0).field_0.level * 2;
  }
  pcVar2 = lys_nodetype2str(node->nodetype);
  pcVar5 = " {\n";
  if (flag != (ly_bool *)0x0) {
    pcVar5 = "";
  }
  plVar7 = (lysc_when *)0x0;
  ly_print_(out,"%*s%s %s%s",(ulong)uVar6,"",pcVar2,node->name,pcVar5);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  substmt = lyplg_ext_nodetype2stmt(node->nodetype);
  yprc_extension_instances(pctx,substmt,'\0',node->exts,flag);
  pplVar3 = lysc_node_when(node);
  while( true ) {
    if (pplVar3 == (lysc_when **)0x0) {
      plVar4 = (lysc_when *)0x0;
    }
    else {
      plVar4 = pplVar3[-1];
    }
    if (plVar4 <= plVar7) break;
    yprc_when(pctx,pplVar3[(long)plVar7],flag);
    plVar7 = (lysc_when *)((long)&plVar7->cond + 1);
  }
  return;
}

Assistant:

static void
yprc_node_common1(struct lys_ypr_ctx *pctx, const struct lysc_node *node, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_when **when;

    ly_print_(pctx->out, "%*s%s %s%s", INDENT, lys_nodetype2str(node->nodetype), node->name, flag ? "" : " {\n");
    LEVEL++;

    yprc_extension_instances(pctx, lyplg_ext_nodetype2stmt(node->nodetype), 0, node->exts, flag);

    when = lysc_node_when(node);
    LY_ARRAY_FOR(when, u) {
        yprc_when(pctx, when[u], flag);
    }
}